

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_stream * nghttp2_session_get_stream(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *stream;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  session_local = (nghttp2_session *)nghttp2_map_find(&session->streams,stream_id);
  if (((session_local == (nghttp2_session *)0x0) ||
      (((session_local->root).recv_reduction & 2) != 0)) ||
     ((session_local->root).remote_window_size == 5)) {
    session_local = (nghttp2_session *)0x0;
  }
  return (nghttp2_stream *)session_local;
}

Assistant:

nghttp2_stream *nghttp2_session_get_stream(nghttp2_session *session,
                                           int32_t stream_id) {
  nghttp2_stream *stream;

  stream = (nghttp2_stream *)nghttp2_map_find(&session->streams, stream_id);

  if (stream == NULL || (stream->flags & NGHTTP2_STREAM_FLAG_CLOSED) ||
      stream->state == NGHTTP2_STREAM_IDLE) {
    return NULL;
  }

  return stream;
}